

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusVtxAttrFloat::emulate_mthd(MthdCelsiusVtxAttrFloat *this)

{
  int local_28;
  MthdCelsiusVtxAttrFloat *this_local;
  
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    if (((this->which == 1) || (this->which == 3)) || (this->which == 4)) {
      if ((*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 < 1) &&
         ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset != 0x10)) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
        [this->which * 4 + 1] = 0;
      }
      if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 < 2) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
        [this->which * 4 + 2] = 0;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
        [this->which * 4 + 3] = 0x3f800000;
      }
    }
    if (this->which == 7) {
      local_28 = 0xb;
    }
    else {
      local_28 = this->which * 4 +
                 *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[local_28] =
         (this->super_SingleMthdTest).super_MthdTest.val;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			if (which == 1 || which == 3 || which == 4) {
				if (idx < 1 && chipset.chipset != 0x10)
					exp.celsius_pipe_vtx[which * 4 + 1] = 0;
				if (idx < 2) {
					exp.celsius_pipe_vtx[which * 4 + 2] = 0;
					exp.celsius_pipe_vtx[which * 4 + 3] = 0x3f800000;
				}
			}
			exp.celsius_pipe_vtx[which == 7 ? 11 : which * 4 + idx] = val;
		}
	}